

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.c
# Opt level: O1

void icetImageCopyColorf(IceTImage image,IceTFloat *color_buffer,IceTEnum out_color_format)

{
  long lVar1;
  int iVar2;
  size_t __n;
  long lVar3;
  IceTEnum type;
  void *__src;
  char *msg;
  
  if (image.opaque_internals == (IceTVoid *)0x0) {
    iVar2 = 0xc000;
  }
  else {
    iVar2 = *(int *)((long)image.opaque_internals + 4);
  }
  if (out_color_format == 0xc002) {
    if (iVar2 == 0xc002) {
      if ((image.opaque_internals == (IceTVoid *)0x0) ||
         (*(int *)((long)image.opaque_internals + 4) != 0xc002)) {
        icetRaiseDiagnostic("Color format is not of type float.",0xfffffffb,1,
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/image.c"
                            ,0x2ae);
        __src = (void *)0x0;
      }
      else {
        __src = (void *)((long)image.opaque_internals + 0x1c);
      }
      if (image.opaque_internals == (IceTVoid *)0x0) {
        __n = 0;
      }
      else {
        __n = (size_t)(*(int *)((long)image.opaque_internals + 0xc) *
                       *(int *)((long)image.opaque_internals + 0x10) * 0x10);
      }
      memcpy(color_buffer,__src,__n);
      return;
    }
    if (iVar2 == 0xc001) {
      if ((image.opaque_internals == (IceTVoid *)0x0) ||
         (*(int *)((long)image.opaque_internals + 4) != 0xc001)) {
        icetRaiseDiagnostic("Color format is not of type ubyte.",0xfffffffb,1,
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/image.c"
                            ,0x292);
        lVar1 = 0;
      }
      else {
        lVar1 = (long)image.opaque_internals + 0x1c;
      }
      if (image.opaque_internals == (IceTVoid *)0x0) {
        iVar2 = 0;
      }
      else {
        iVar2 = *(int *)((long)image.opaque_internals + 0xc) *
                *(int *)((long)image.opaque_internals + 0x10) * 4;
      }
      if (0 < iVar2) {
        lVar3 = 0;
        do {
          color_buffer[lVar3] = (IceTFloat)((float)*(byte *)(lVar1 + lVar3) / 255.0);
          lVar3 = lVar3 + 1;
        } while (iVar2 != (int)lVar3);
      }
      return;
    }
    if (iVar2 == 0xc000) {
      msg = "Input image has no color data.";
      type = 0xfffffffb;
      iVar2 = 0x324;
    }
    else {
      msg = "Unexpected format combination.";
      type = 0xffffffff;
      iVar2 = 0x33a;
    }
  }
  else {
    msg = "Color format is not of type float.";
    type = 0xfffffffe;
    iVar2 = 799;
  }
  icetRaiseDiagnostic(msg,type,1,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/image.c"
                      ,iVar2);
  return;
}

Assistant:

void icetImageCopyColorf(const IceTImage image,
                         IceTFloat *color_buffer,
                         IceTEnum out_color_format)
{
    IceTEnum in_color_format = icetImageGetColorFormat(image);

    if (out_color_format != ICET_IMAGE_COLOR_RGBA_FLOAT) {
        icetRaiseError("Color format is not of type float.",
                       ICET_INVALID_ENUM);
        return;
    }
    if (in_color_format == ICET_IMAGE_COLOR_NONE) {
        icetRaiseError("Input image has no color data.",
                       ICET_INVALID_OPERATION);
        return;
    }

    if (in_color_format == out_color_format) {
        const IceTFloat *in_buffer = icetImageGetColorcf(image);
        IceTSizeType color_format_bytes = (  icetImageGetNumPixels(image)
                                           * colorPixelSize(in_color_format) );
        memcpy(color_buffer, in_buffer, color_format_bytes);
    } else if (   (in_color_format == ICET_IMAGE_COLOR_RGBA_UBYTE)
               && (out_color_format == ICET_IMAGE_COLOR_RGBA_FLOAT) ) {
        const IceTUByte *in_buffer = icetImageGetColorcub(image);
        IceTSizeType num_pixels = icetImageGetNumPixels(image);
        IceTSizeType i;
        const IceTUByte *in;
        IceTFloat *out;
        for (i = 0, in = in_buffer, out = color_buffer; i < 4*num_pixels;
             i++, in++, out++) {
            out[0] = (IceTFloat)in[0]/255.0f;
        }
    } else {
        icetRaiseError("Unexpected format combination.",
                       ICET_SANITY_CHECK_FAIL);
    }
}